

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          string_view text,SourceLocation includedFrom,SourceLibrary *library)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  atomic<unsigned_int> *paVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint __val;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  uint uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  size_t sVar13;
  string_view bufferPath;
  string __str;
  string temp;
  SmallVector<char,_40UL> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  SourceManager *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [24];
  char acStack_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  _Var11._M_p = (pointer)path._M_str;
  sVar13 = path._M_len;
  local_d8 = this;
  if (path._M_len != 0) goto LAB_00148ff4;
  paVar4 = &local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_7_ = 0x656d616e6e753c;
  local_70.field_2._M_local_buf[7] = 'd';
  local_70.field_2._8_7_ = 0x7265666675625f;
  local_70._M_string_length = 0xf;
  local_70.field_2._M_local_buf[0xf] = '\0';
  uVar7 = 1;
  LOCK();
  paVar2 = &this->unnamedBufferCount;
  __val = (paVar2->super___atomic_base<unsigned_int>)._M_i;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (9 < __val) {
    uVar6 = 4;
    uVar9 = __val;
    do {
      uVar7 = uVar6;
      if (uVar9 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_00149151;
      }
      if (uVar9 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_00149151;
      }
      if (uVar9 < 10000) goto LAB_00149151;
      bVar5 = 99999 < uVar9;
      uVar6 = uVar7 + 4;
      uVar9 = uVar9 / 10000;
    } while (bVar5);
    uVar7 = uVar7 + 1;
  }
LAB_00149151:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_f8,(ulong)uVar7,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_f8._M_dataplus._M_p,(uint)local_f8._M_string_length,__val);
  uVar3 = CONCAT44(local_f8._M_string_length._4_4_,(uint)local_f8._M_string_length) +
          local_70._M_string_length;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    uVar12 = CONCAT17(local_70.field_2._M_local_buf[7],local_70.field_2._M_allocated_capacity._0_7_)
    ;
  }
  if (uVar12 < uVar3) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar10 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < uVar3) goto LAB_001491c1;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f8,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  else {
LAB_001491c1:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_70,local_f8._M_dataplus._M_p,
                       CONCAT44(local_f8._M_string_length._4_4_,(uint)local_f8._M_string_length));
  }
  local_118._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar1) {
    local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_118._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_2_ = 0x3e;
  local_50._M_string_length = 1;
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    uVar10 = local_118.field_2._M_allocated_capacity;
  }
  if ((local_118._M_string_length + 1 < 0x10) && ((ulong)uVar10 < local_118._M_string_length + 1)) {
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,local_118._M_dataplus._M_p,local_118._M_string_length);
  }
  else {
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_118,local_50._M_dataplus._M_p,1);
  }
  local_b0._0_8_ = (pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._0_8_ == paVar1) {
    local_b0._16_8_ = paVar1->_M_allocated_capacity;
    acStack_98._0_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_b0._0_8_ = local_b0 + 0x10;
  }
  else {
    local_b0._16_8_ = paVar1->_M_allocated_capacity;
  }
  local_b0._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
            );
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                             local_50.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  _Var11._M_p = local_d0._M_dataplus._M_p;
  sVar13 = local_d0._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT17(local_70.field_2._M_local_buf[7],
                             local_70.field_2._M_allocated_capacity._0_7_) + 1);
    _Var11._M_p = local_d0._M_dataplus._M_p;
    sVar13 = local_d0._M_string_length;
  }
LAB_00148ff4:
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0x28;
  local_b0._0_8_ = acStack_98;
  SmallVectorBase<char>::insert<const_char_*>
            ((SmallVectorBase<char> *)local_b0,acStack_98,text._M_str,text._M_str + text._M_len);
  if ((local_b0._8_8_ == 0) || (*(const_iterator)(local_b0._0_8_ + (local_b0._8_8_ - 1)) != '\0')) {
    local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffffffffff00;
    SmallVectorBase<char>::emplace_back<char>((SmallVectorBase<char> *)local_b0,(char *)&local_118);
  }
  bufferPath._M_str = _Var11._M_p;
  bufferPath._M_len = sVar13;
  assignBuffer(__return_storage_ptr__,local_d8,bufferPath,(SmallVector<char,_40UL> *)local_b0,
               includedFrom,library);
  if ((char *)local_b0._0_8_ != acStack_98) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::assignText(std::string_view path, std::string_view text,
                                       SourceLocation includedFrom, const SourceLibrary* library) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    SmallVector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom, library);
}